

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void ImGui::DockContextUpdateUndocking(ImGuiContext *ctx)

{
  ImGuiDockContext *pIVar1;
  ImGuiID *pIVar2;
  ImGuiDockRequest *pIVar3;
  ImGuiDockNode *src_node;
  ImGuiWindow *window;
  ImGuiDockNode *pIVar4;
  bool in_DL;
  long lVar5;
  long lVar6;
  bool bVar7;
  
  pIVar1 = ctx->DockContext;
  if (((ctx->IO).ConfigFlags & 0x40) == 0) {
    if ((0 < (pIVar1->Nodes).Data.Size) || (0 < (pIVar1->Requests).Size)) {
      DockBuilderRemoveNodeDockedWindows((ImGui *)0x0,1,in_DL);
      DockBuilderRemoveNodeChildNodes(0);
      return;
    }
  }
  else {
    if (((ctx->IO).ConfigDockingNoSplit == true) && (0 < (pIVar1->Nodes).Data.Size)) {
      lVar5 = 8;
      lVar6 = 0;
      do {
        pIVar2 = *(ImGuiID **)((long)&((pIVar1->Nodes).Data.Data)->key + lVar5);
        if (((pIVar2 != (ImGuiID *)0x0) && (*(long *)(pIVar2 + 4) == 0)) &&
           (*(long *)(pIVar2 + 6) != 0)) {
          DockBuilderRemoveNodeChildNodes(*pIVar2);
        }
        lVar6 = lVar6 + 1;
        lVar5 = lVar5 + 0x10;
      } while (lVar6 < (pIVar1->Nodes).Data.Size);
    }
    if (pIVar1->WantFullRebuild == true) {
      DockContextRebuildNodes(ctx);
      pIVar1->WantFullRebuild = false;
    }
    if (0 < (pIVar1->Requests).Size) {
      lVar5 = 0;
      do {
        pIVar3 = (pIVar1->Requests).Data;
        if (pIVar3[lVar5].Type == ImGuiDockRequestType_Undock) {
          if ((ImGuiContext *)pIVar3[lVar5].UndockTargetWindow == (ImGuiContext *)0x0) {
            src_node = pIVar3[lVar5].UndockTargetNode;
            if (src_node != (ImGuiDockNode *)0x0) {
              pIVar4 = src_node->ParentNode;
              if ((pIVar4 == (ImGuiDockNode *)0x0) || ((src_node->LocalFlags & 0x800) != 0)) {
                pIVar4 = DockContextAddNode(ctx,0);
                DockNodeMoveWindows(pIVar4,src_node);
                DockSettingsRenameNodeReferences(src_node->ID,pIVar4->ID);
                if (0 < (pIVar4->Windows).Size) {
                  lVar6 = 0;
                  do {
                    window = (pIVar4->Windows).Data[lVar6];
                    UpdateWindowParentAndRootLinks(window,window->Flags,(ImGuiWindow *)0x0);
                    lVar6 = lVar6 + 1;
                  } while (lVar6 < (pIVar4->Windows).Size);
                }
              }
              else {
                bVar7 = pIVar4->ChildNodes[0] == src_node;
                pIVar4->ChildNodes[!bVar7] = (ImGuiDockNode *)0x0;
                DockNodeTreeMerge(ctx,src_node->ParentNode,src_node->ParentNode->ChildNodes[bVar7]);
                *(ushort *)&src_node->ParentNode->field_0xb0 =
                     (ushort)*(undefined4 *)&src_node->ParentNode->field_0xb0 & 0xfe3f | 0x80;
                src_node->ParentNode = (ImGuiDockNode *)0x0;
                pIVar4 = src_node;
              }
              *(ushort *)&pIVar4->field_0xb0 =
                   (ushort)*(undefined4 *)&pIVar4->field_0xb0 & 0xffc0 | 0x12;
              pIVar4->field_0xb2 = pIVar4->field_0xb2 | 1;
              if (GImGui->SettingsDirtyTimer <= 0.0) {
                GImGui->SettingsDirtyTimer = (GImGui->IO).IniSavingRate;
              }
            }
          }
          else {
            DockContextProcessUndockWindow
                      ((ImGuiContext *)pIVar3[lVar5].UndockTargetWindow,(ImGuiWindow *)0x1,
                       (bool)((char)lVar5 * '@'));
          }
        }
        lVar5 = lVar5 + 1;
      } while (lVar5 < (pIVar1->Requests).Size);
    }
  }
  return;
}

Assistant:

void ImGui::DockContextUpdateUndocking(ImGuiContext* ctx)
{
    ImGuiContext& g = *ctx;
    ImGuiDockContext* dc = ctx->DockContext;
    if (!(g.IO.ConfigFlags & ImGuiConfigFlags_DockingEnable))
    {
        if (dc->Nodes.Data.Size > 0 || dc->Requests.Size > 0)
            DockContextClearNodes(ctx, 0, true);
        return;
    }

    // Setting NoSplit at runtime merges all nodes
    if (g.IO.ConfigDockingNoSplit)
        for (int n = 0; n < dc->Nodes.Data.Size; n++)
            if (ImGuiDockNode* node = (ImGuiDockNode*)dc->Nodes.Data[n].val_p)
                if (node->IsRootNode() && node->IsSplitNode())
                {
                    DockBuilderRemoveNodeChildNodes(node->ID);
                    //dc->WantFullRebuild = true;
                }

    // Process full rebuild
#if 0
    if (ImGui::IsKeyPressed(ImGui::GetKeyIndex(ImGuiKey_C)))
        dc->WantFullRebuild = true;
#endif
    if (dc->WantFullRebuild)
    {
        DockContextRebuildNodes(ctx);
        dc->WantFullRebuild = false;
    }

    // Process Undocking requests (we need to process them _before_ the UpdateMouseMovingWindowNewFrame call in NewFrame)
    for (int n = 0; n < dc->Requests.Size; n++)
    {
        ImGuiDockRequest* req = &dc->Requests[n];
        if (req->Type == ImGuiDockRequestType_Undock && req->UndockTargetWindow)
            DockContextProcessUndockWindow(ctx, req->UndockTargetWindow);
        else if (req->Type == ImGuiDockRequestType_Undock && req->UndockTargetNode)
            DockContextProcessUndockNode(ctx, req->UndockTargetNode);
    }
}